

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

double get_frame_importance(TplParams *tpl_data,int gf_frame_index)

{
  int iVar1;
  TplDepFrame *pTVar2;
  TplDepStats *pTVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  double dStack_40;
  
  pTVar2 = tpl_data->tpl_frame;
  iVar15 = 1 << (tpl_data->tpl_stats_block_mis_log2 & 0x1f);
  iVar14 = pTVar2[gf_frame_index].mi_rows;
  if (iVar14 < 1) {
    dVar16 = 0.0;
  }
  else {
    pTVar3 = pTVar2[gf_frame_index].tpl_stats_ptr;
    iVar1 = pTVar2[gf_frame_index].stride;
    iVar11 = pTVar2[gf_frame_index].mi_cols;
    dVar10 = 0.0;
    dStack_40 = 0.0;
    iVar13 = 0;
    dVar16 = 1.0;
    do {
      if (0 < iVar11) {
        iVar14 = 0;
        do {
          auVar8._8_4_ = SUB84(dStack_40,0);
          auVar8._0_8_ = dVar10;
          auVar8._12_4_ = (int)((ulong)dStack_40 >> 0x20);
          iVar12 = (iVar14 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) +
                   (iVar13 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) * iVar1;
          dVar9 = (double)pTVar3[iVar12].srcrf_dist;
          iVar11 = pTVar2[gf_frame_index].base_rdmult;
          lVar4 = pTVar3[iVar12].mc_dep_rate;
          lVar5 = pTVar3[iVar12].mc_dep_dist;
          dVar6 = (double)(pTVar3[iVar12].recrf_dist << 7);
          if (dVar6 <= 1.0) {
            dVar6 = 1.0;
          }
          dVar7 = log(dVar6);
          dVar6 = log((double)(lVar5 * 0x80 + (iVar11 * lVar4 + 0x100 >> 9)) + dVar6);
          dStack_40 = auVar8._8_8_;
          dVar16 = dVar16 + dVar9;
          dVar10 = dVar10 + dVar9 * dVar6;
          dStack_40 = dStack_40 + dVar9 * dVar7;
          iVar14 = iVar14 + iVar15;
          iVar11 = pTVar2[gf_frame_index].mi_cols;
        } while (iVar14 < iVar11);
        iVar14 = pTVar2[gf_frame_index].mi_rows;
      }
      iVar13 = iVar13 + iVar15;
    } while (iVar13 < iVar14);
    dVar16 = (dVar10 - dStack_40) / dVar16;
  }
  dVar16 = exp(dVar16);
  return dVar16;
}

Assistant:

static double get_frame_importance(const TplParams *tpl_data,
                                   int gf_frame_index) {
  const TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_frame_index];
  const TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 1;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      const int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      dist_scaled = AOMMAX(dist_scaled, 1);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }
  return exp((mc_dep_cost_base - intra_cost_base) / cbcmp_base);
}